

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O2

Variable __thiscall LiteScript::ClassObject::GetMember(ClassObject *this,char *name)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  char *in_RDX;
  uint *extraout_RDX;
  long lVar5;
  long lVar6;
  Variable VVar7;
  uint *puVar4;
  
  lVar1 = *(long *)(name + 8);
  lVar2 = *(long *)name;
  lVar6 = 0x10;
  lVar5 = 0;
  do {
    if (((lVar1 - lVar2) / 0x30 & 0xffffffffU) * 0x30 + 0x30 == lVar5 + 0x30) {
      VVar7 = Class::GetUnstaticMember((Class *)this,*(char **)(name + 0x38));
      puVar4 = VVar7.nb_ref;
      goto LAB_0013de41;
    }
    lVar6 = lVar6 + -0x30;
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (lVar5 + *(long *)name),in_RDX);
    lVar5 = lVar5 + 0x30;
  } while (!bVar3);
  Variable::Variable((Variable *)this,(Variable *)(*(long *)name - lVar6));
  puVar4 = extraout_RDX;
LAB_0013de41:
  VVar7.nb_ref = puVar4;
  VVar7.obj = (Object *)this;
  return VVar7;
}

Assistant:

LiteScript::Variable LiteScript::ClassObject::GetMember(const char *name) {
    for (unsigned int i = 0, sz = this->members.size(); i < sz; i++) {
        if (this->members[i].first == name)
            return Variable(this->members[i].second);
    }
    return this->ClassBase->GetUnstaticMember(name);
}